

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_reference_finite_element.h
# Opt level: O0

size_type __thiscall
lf::fe::ScalarReferenceFiniteElement<double>::NumRefShapeFunctions
          (ScalarReferenceFiniteElement<double> *this,dim_t codim)

{
  runtime_error *this_00;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  dim_t local_14;
  ScalarReferenceFiniteElement<double> *pSStack_10;
  dim_t codim_local;
  ScalarReferenceFiniteElement<double> *this_local;
  
  local_14 = codim;
  pSStack_10 = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Illegal call for non-uniform sub-entity dof numbers");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"false",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/scalar_reference_finite_element.h"
             ,&local_1f9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d0,&local_1f8,0x99,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] virtual size_type NumRefShapeFunctions(dim_t codim) const {
    LF_VERIFY_MSG(false, "Illegal call for non-uniform sub-entity dof numbers");
    return 0;
  }